

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedPitch(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  uint32_t local_20;
  uint32_t BitsPerPixel;
  uint32_t AlignedPitch;
  uint32_t AlignedWidth;
  uint32_t MipLevel_local;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[9])(this,(ulong)MipLevel);
  local_20 = (this->Surf).BitsPerPixel;
  if ((((ulong)(this->AuxSurf).Flags.Gpu >> 1 & 1) != 0) &&
     (((ulong)(this->AuxSurf).Flags.Gpu >> 0x29 & 1) != 0)) {
    local_20 = 8;
  }
  return iVar1 * local_20 >> 3;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedPitch(uint32_t MipLevel)
{
    uint32_t AlignedWidth;
    uint32_t AlignedPitch;
    uint32_t BitsPerPixel;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    // See note in GetPaddedWidth.
    AlignedWidth = GetPaddedWidth(MipLevel);

    BitsPerPixel = Surf.BitsPerPixel;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        BitsPerPixel = 8; //Aux surface are 8bpp
    }

    AlignedPitch = AlignedWidth * BitsPerPixel >> 3;

    return AlignedPitch;
}